

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall
leveldb::DBTest_IterMultiWithDelete_Test::~DBTest_IterMultiWithDelete_Test
          (DBTest_IterMultiWithDelete_Test *this)

{
  DBTest::~DBTest(&this->super_DBTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DBTest, IterMultiWithDelete) {
  do {
    ASSERT_LEVELDB_OK(Put("a", "va"));
    ASSERT_LEVELDB_OK(Put("b", "vb"));
    ASSERT_LEVELDB_OK(Put("c", "vc"));
    ASSERT_LEVELDB_OK(Delete("b"));
    ASSERT_EQ("NOT_FOUND", Get("b"));

    Iterator* iter = db_->NewIterator(ReadOptions());
    iter->Seek("c");
    ASSERT_EQ(IterStatus(iter), "c->vc");
    iter->Prev();
    ASSERT_EQ(IterStatus(iter), "a->va");
    delete iter;
  } while (ChangeOptions());
}